

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_reader.h
# Opt level: O1

bool __thiscall
stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>::operator<
          (CoordWithIndex<double,_unsigned_int> *this,CoordWithIndex<double,_unsigned_int> *c)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  
  dVar1 = this->data[0];
  dVar2 = c->data[0];
  bVar5 = true;
  if (dVar2 <= dVar1) {
    if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
      dVar3 = c->data[1];
      bVar5 = dVar3 != this->data[1];
      bVar4 = this->data[1] <= dVar3;
      if (dVar1 != dVar2 || bVar4 && bVar5) {
        return bVar4 && bVar5;
      }
      if ((this->data[1] == c->data[1]) && (!NAN(this->data[1]) && !NAN(c->data[1]))) {
        return this->data[2] <= c->data[2] && c->data[2] != this->data[2];
      }
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool operator < (const CoordWithIndex& c) const
    {
      return (data[0] < c[0])
          || (data[0] == c[0] && data[1] < c[1])
          || (data[0] == c[0] && data[1] == c[1] && data[2] < c[2]);
    }